

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  u8 *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *pOld;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  u64 iDelta;
  long local_68;
  u64 local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = p->pConfig->eDetail;
  uVar8 = pIter->iLeafOffset;
  iVar9 = pIter->pLeaf->szLeaf;
  puVar2 = pIter->pLeaf->p;
  iVar4 = pIter->iEndofDoclist;
  if (iVar9 < pIter->iEndofDoclist) {
    iVar4 = iVar9;
  }
  local_68 = 0;
  uVar10 = uVar8 & 0xffffffff;
  do {
    local_48 = 0;
    iVar9 = (int)uVar10;
    if (iVar1 == 1) {
      iVar5 = iVar9;
      if ((iVar9 < iVar4) && (puVar2[iVar9] == '\0')) {
        lVar7 = (long)iVar9 + 1;
        iVar6 = (int)lVar7;
        iVar5 = iVar6;
        if ((iVar6 < iVar4) && (iVar5 = iVar9 + 2, puVar2[lVar7] != '\0')) {
          iVar5 = iVar6;
        }
      }
    }
    else {
      local_3c = (uint)puVar2[iVar9];
      iVar5 = 1;
      if ((char)puVar2[iVar9] < '\0') {
        iVar5 = sqlite3Fts5GetVarint32(puVar2 + iVar9,&local_3c);
      }
      iVar5 = iVar5 + iVar9 + (int)local_3c / 2;
    }
    if (iVar4 <= iVar5) goto LAB_001e1011;
    bVar3 = sqlite3Fts5GetVarint(puVar2 + iVar5,&local_48);
    pIter->iRowid = pIter->iRowid + local_48;
    iVar9 = pIter->nRowidOffset;
    pOld = pIter->aRowidOffset;
    if (local_68 < iVar9) {
      iVar9 = (int)uVar8;
    }
    else {
      iVar6 = sqlite3_initialize();
      if (iVar6 != 0) {
LAB_001e1005:
        p->rc = 7;
LAB_001e1011:
        pIter->iRowidOffset = (int)local_68;
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        fts5SegIterLoadNPos(p,pIter);
        return;
      }
      lVar7 = (long)iVar9 + 8;
      pOld = (int *)sqlite3Realloc(pOld,lVar7 * 4);
      if (pOld == (int *)0x0) goto LAB_001e1005;
      pIter->aRowidOffset = pOld;
      pIter->nRowidOffset = (int)lVar7;
      iVar9 = (int)pIter->iLeafOffset;
    }
    uVar10 = (ulong)(iVar5 + (uint)bVar3);
    pOld[local_68] = iVar9;
    local_68 = local_68 + 1;
    uVar8 = (ulong)(int)(iVar5 + (uint)bVar3);
    pIter->iLeafOffset = uVar8;
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    u64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], &iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}